

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2016.h
# Opt level: O3

void __thiscall PRED<TTA>::PerformLabeling(PRED<TTA> *this)

{
  long lVar1;
  uint *puVar2;
  char *pcVar3;
  undefined8 uVar4;
  char cVar5;
  int *piVar6;
  Mat1b *pMVar7;
  Mat1i *pMVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint *puVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  Mat local_b8 [96];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar6 = *(int **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  cv::Mat::Mat(local_b8,*piVar6,piVar6[1],4);
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  cv::Mat::operator=(local_b8,(Scalar_ *)&local_58);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_b8);
  cv::Mat::~Mat(local_b8);
  uVar4 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar4 >> 0x20) + 1) / 2) * (((int)uVar4 + 1) / 2) + 1);
  puVar2 = TTA::rtable_;
  *TTA::rtable_ = 0;
  puVar12 = TTA::tail_;
  puVar25 = TTA::next_;
  TTA::length_ = 1;
  pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar31 = *(int *)&pMVar7->field_0xc;
  lVar32 = (long)iVar31;
  uVar15 = *(uint *)&pMVar7->field_0x8;
  if (0 < lVar32) {
    lVar33 = *(long *)&pMVar7->field_0x10;
    lVar35 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    uVar27 = 0;
    do {
      iVar30 = (int)uVar27;
      if (*(char *)(lVar33 + iVar30) != '\0') {
        uVar27 = (ulong)TTA::length_;
        puVar2[uVar27] = TTA::length_;
        puVar25[uVar27] = 0xffffffff;
        puVar12[TTA::length_] = TTA::length_;
        uVar14 = TTA::length_ + 1;
        *(uint *)(lVar35 + (long)iVar30 * 4) = TTA::length_;
        TTA::length_ = uVar14;
        if (iVar31 <= iVar30 + 1) break;
        uVar27 = (ulong)(iVar30 + 1);
        while (*(char *)(lVar33 + uVar27) != '\0') {
          *(undefined4 *)(lVar35 + uVar27 * 4) =
               *(undefined4 *)(lVar35 + (long)((int)uVar27 + -1) * 4);
          uVar27 = uVar27 + 1;
          if (iVar31 == (int)uVar27) goto LAB_001a7cca;
        }
      }
      uVar14 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar14;
    } while ((int)uVar14 < iVar31);
  }
LAB_001a7cca:
  if (1 < (int)uVar15) {
    uVar27 = 1;
    lVar33 = lVar32 + -1;
    lVar35 = 0;
    do {
      pMVar7 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar28 = *(long *)&pMVar7->field_0x10;
      lVar9 = **(long **)&pMVar7->field_0x48;
      lVar34 = lVar9 * uVar27;
      lVar22 = lVar28 + lVar34;
      pcVar20 = (char *)(lVar22 - lVar9);
      lVar10 = *(long *)&pMVar8->field_0x10;
      lVar11 = **(long **)&pMVar8->field_0x48;
      lVar16 = lVar11 * uVar27;
      puVar2 = (uint *)(lVar10 + lVar16);
      puVar25 = (uint *)((long)puVar2 - lVar11);
      iVar31 = (int)lVar33;
      if (iVar31 == 0) {
        if (*(char *)(lVar28 + lVar34) != '\0') {
          if (*pcVar20 == '\0') {
            uVar29 = (ulong)TTA::length_;
            TTA::rtable_[uVar29] = TTA::length_;
            TTA::next_[uVar29] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar14 = TTA::length_ + 1;
            *puVar2 = TTA::length_;
            TTA::length_ = uVar14;
          }
          else {
            *puVar2 = *puVar25;
          }
        }
      }
      else {
        lVar18 = lVar33;
        if (*(char *)(lVar28 + lVar34) == '\0') {
          uVar29 = 0;
          goto LAB_001a7e4f;
        }
        if (*pcVar20 == '\0') {
          if (pcVar20[1] == '\0') {
            uVar29 = (ulong)TTA::length_;
            TTA::rtable_[uVar29] = TTA::length_;
            TTA::next_[uVar29] = 0xffffffff;
            TTA::tail_[TTA::length_] = TTA::length_;
            uVar14 = TTA::length_ + 1;
            *puVar2 = TTA::length_;
            TTA::length_ = uVar14;
            iVar30 = 0;
            goto LAB_001a807d;
          }
          *puVar2 = puVar25[1];
          iVar30 = 0;
          goto LAB_001a81cb;
        }
        *puVar2 = *puVar25;
        uVar29 = 0;
LAB_001a81f8:
        iVar30 = (int)uVar29;
        if (iVar30 + 1 < iVar31) {
          lVar26 = (long)iVar30;
          lVar19 = lVar16 + lVar26 * 4;
          lVar24 = 0;
          while( true ) {
            if (*(char *)(lVar26 + lVar34 + lVar28 + 1 + lVar24) == '\0') {
              uVar14 = (int)(lVar26 + 1) + (int)lVar24;
              goto LAB_001a8316;
            }
            if (*(char *)(lVar9 * lVar35 + lVar26 + lVar28 + 1 + lVar24) == '\0') break;
            *(undefined4 *)(lVar10 + 4 + lVar19 + lVar24 * 4) =
                 *(undefined4 *)(lVar11 * lVar35 + lVar26 * 4 + lVar10 + 4 + lVar24 * 4);
            lVar24 = lVar24 + 1;
            if (lVar26 + (1 - lVar32) + 1 + lVar24 == 0) {
              iVar30 = iVar30 + (int)lVar24;
              goto LAB_001a82de;
            }
          }
          uVar29 = lVar26 + 1 + lVar24;
          iVar30 = iVar30 + (int)lVar24;
          iVar13 = iVar30 + 2;
          if (pcVar20[iVar13] == '\0') {
            *(uint *)(lVar19 + lVar10 + 4 + lVar24 * 4) = puVar2[iVar30];
            iVar30 = (int)uVar29;
            goto LAB_001a807d;
          }
          uVar14 = TTA::Merge(puVar2[iVar30],puVar25[iVar13]);
          *(uint *)(lVar19 + lVar10 + 4 + lVar24 * 4) = uVar14;
LAB_001a81bc:
          do {
            iVar30 = (int)uVar29;
LAB_001a81cb:
            lVar19 = (long)iVar30;
            uVar29 = lVar19 + 1;
            cVar5 = *(char *)(lVar22 + 1 + lVar19);
            if (iVar31 <= (int)uVar29) {
              if (cVar5 != '\0') {
                puVar2[lVar19 + 1] = puVar25[lVar19 + 1];
              }
              goto LAB_001a8393;
            }
            if (cVar5 != '\0') {
              puVar2[lVar19 + 1] = puVar25[lVar19 + 1];
              goto LAB_001a81f8;
            }
LAB_001a7e4f:
            while( true ) {
              lVar26 = (long)(int)uVar29;
              lVar19 = lVar26 << 0x20;
              lVar24 = 0;
              do {
                lVar21 = lVar19;
                lVar23 = lVar21 >> 0x20;
                if (lVar33 <= lVar26 + lVar24 + 1) {
                  lVar28 = lVar21 + 0x100000000 >> 0x20;
                  if (*(char *)(lVar22 + lVar28) == '\0') goto LAB_001a8393;
                  if (pcVar20[lVar28] == '\0') {
                    if (pcVar20[lVar23] == '\0') {
                      uVar29 = (ulong)TTA::length_;
                      TTA::rtable_[uVar29] = TTA::length_;
                      TTA::next_[uVar29] = 0xffffffff;
                      TTA::tail_[TTA::length_] = TTA::length_;
                      uVar14 = TTA::length_ + 1;
                      puVar2[lVar28] = TTA::length_;
                      TTA::length_ = uVar14;
                      goto LAB_001a8393;
                    }
                    uVar14 = puVar25[lVar23];
                  }
                  else {
                    uVar14 = puVar25[lVar28];
                  }
                  puVar2[lVar28] = uVar14;
                  goto LAB_001a8393;
                }
                lVar1 = lVar24 + 1;
                pcVar3 = (char *)(lVar26 + lVar34 + lVar28 + 1 + lVar24);
                lVar19 = lVar21 + 0x100000000;
                lVar24 = lVar1;
              } while (*pcVar3 == '\0');
              uVar29 = (uVar29 & 0xffffffff) + lVar1;
              if (*(char *)(lVar1 + lVar9 * lVar35 + lVar26 + lVar28) != '\0') {
                *(undefined4 *)(lVar16 + lVar26 * 4 + lVar10 + lVar1 * 4) =
                     *(undefined4 *)(lVar11 * lVar35 + lVar26 * 4 + lVar10 + lVar1 * 4);
                goto LAB_001a81f8;
              }
              lVar19 = lVar21 + 0x200000000 >> 0x20;
              if (pcVar20[lVar19] != '\0') break;
              if (pcVar20[lVar23] == '\0') {
                uVar17 = (ulong)TTA::length_;
                TTA::rtable_[uVar17] = TTA::length_;
                TTA::next_[uVar17] = 0xffffffff;
                TTA::tail_[TTA::length_] = TTA::length_;
                uVar14 = TTA::length_ + 1;
                *(uint *)(lVar16 + lVar26 * 4 + lVar10 + lVar1 * 4) = TTA::length_;
                TTA::length_ = uVar14;
              }
              else {
                *(uint *)(lVar16 + lVar26 * 4 + lVar10 + lVar1 * 4) = puVar25[lVar23];
              }
              iVar30 = (int)uVar29;
LAB_001a807d:
              if (iVar31 <= iVar30 + 1) {
                lVar18 = (long)(iVar30 + 1);
LAB_001a813d:
                if (*(char *)(lVar22 + lVar18) != '\0') goto LAB_001a838b;
                goto LAB_001a8393;
              }
              lVar24 = (long)iVar30;
              lVar26 = lVar24 << 0x20;
              lVar19 = lVar16 + lVar24 * 4;
              lVar21 = lVar10 + lVar19;
              lVar23 = 0;
              while (*(char *)(lVar34 + lVar24 + lVar28 + 1 + lVar23) != '\0') {
                if (*(char *)(lVar9 * lVar35 + lVar24 + lVar28 + 2 + lVar23) != '\0') {
                  uVar29 = (ulong)(uint)(iVar30 + 1 + (int)lVar23);
                  uVar14 = TTA::Merge(*(uint *)((long)puVar2 + (lVar26 >> 0x1e)),
                                      *(uint *)(lVar11 * lVar35 + lVar24 * 4 + lVar10 + 8 +
                                               lVar23 * 4));
                  *(uint *)(lVar19 + lVar10 + 4 + lVar23 * 4) = uVar14;
                  goto LAB_001a81bc;
                }
                *(undefined4 *)(lVar21 + 4 + lVar23 * 4) = *(undefined4 *)(lVar21 + lVar23 * 4);
                lVar26 = lVar26 + 0x100000000;
                lVar23 = lVar23 + 1;
                if ((1 - lVar32) + lVar24 + 1 + lVar23 == 0) {
                  iVar30 = iVar30 + (int)lVar23;
                  goto LAB_001a813d;
                }
              }
              uVar14 = iVar30 + 1 + (int)lVar23;
LAB_001a8316:
              uVar29 = (ulong)uVar14;
            }
            if (pcVar20[lVar23] == '\0') {
              uVar14 = puVar25[lVar19];
            }
            else {
              uVar14 = TTA::Merge(puVar25[lVar23],puVar25[lVar19]);
            }
            *(uint *)(lVar16 + lVar26 * 4 + lVar10 + lVar1 * 4) = uVar14;
            uVar29 = uVar29 & 0xffffffff;
          } while( true );
        }
        lVar18 = (long)(iVar30 + 1);
LAB_001a82de:
        if (*(char *)(lVar22 + lVar18) != '\0') {
          if (pcVar20[lVar18] == '\0') {
LAB_001a838b:
            uVar14 = puVar2[iVar30];
          }
          else {
            uVar14 = puVar25[lVar18];
          }
          puVar2[lVar18] = uVar14;
        }
      }
LAB_001a8393:
      uVar27 = uVar27 + 1;
      lVar35 = lVar35 + 1;
    } while (uVar27 != uVar15);
  }
  puVar2 = TTA::rtable_;
  uVar15 = 1;
  if (1 < TTA::length_) {
    uVar15 = 1;
    uVar27 = 1;
    do {
      if (uVar27 == puVar2[uVar27]) {
        uVar15 = uVar15 + 1;
        uVar14 = uVar15;
      }
      else {
        uVar14 = puVar2[puVar2[uVar27]];
      }
      puVar2[uVar27] = uVar14;
      uVar27 = uVar27 + 1;
    } while (uVar27 < TTA::length_);
  }
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar15;
  puVar2 = TTA::rtable_;
  pMVar8 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  iVar31 = *(int *)&pMVar8->field_0x8;
  if (0 < iVar31) {
    lVar32 = *(long *)&pMVar8->field_0x10;
    lVar33 = **(long **)&pMVar8->field_0x48;
    lVar35 = 0;
    do {
      iVar30 = *(int *)&pMVar8->field_0xc;
      if ((long)iVar30 != 0) {
        lVar28 = 0;
        do {
          *(uint *)(lVar32 + lVar28) = puVar2[*(uint *)(lVar32 + lVar28)];
          lVar28 = lVar28 + 4;
        } while ((long)iVar30 * 4 != lVar28);
        iVar31 = *(int *)&pMVar8->field_0x8;
      }
      lVar35 = lVar35 + 1;
      lVar32 = lVar32 + lVar33;
    } while (lVar35 < iVar31);
  }
  TTA::Dealloc();
  return;
}

Assistant:

void PerformLabeling()
    {
        img_labels_ = cv::Mat1i(img_.size(), 0); // Call to memset

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::Setup();

        // Rosenfeld Mask
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols);
        int h(img_.rows);

#define CONDITION_X img_row[c]>0
#define CONDITION_P img_row_prev[c-1]>0
#define CONDITION_Q img_row_prev[c]>0
#define CONDITION_R img_row_prev[c+1]>0

#define ACTION_1 // nothing to do 
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); // new label
#define ACTION_3 img_labels_row[c] = img_labels_row_prev[c - 1]; // x <- p
#define ACTION_4 img_labels_row[c] = img_labels_row_prev[c]; // x <- q
#define ACTION_5 img_labels_row[c] = img_labels_row_prev[c + 1]; // x <- r
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 1]; // x <- s
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev[c - 1], img_labels_row_prev[c + 1]); // x <- p + r
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row[c - 1], img_labels_row_prev[c + 1]); // x <- s + r

#define COLS w

        {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(0);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(0);

#include "labeling_grana_2016_forest_0.inc.h"

        }

        for (int r = 1; r < h; ++r) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int *)(((char *)img_labels_row) - img_labels_.step.p[0]);

#include "labeling_grana_2016_forest.inc.h"  

        }//End rows's for

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8

#undef CONDITION_X
#undef CONDITION_P
#undef CONDITION_Q
#undef CONDITION_R

    // Second scan
        n_labels_ = LabelsSolver::Flatten();

        for (int r_i = 0; r_i < img_labels_.rows; ++r_i) {
            unsigned int *b = img_labels_.ptr<unsigned int>(r_i);
            unsigned int *e = b + img_labels_.cols;
            for (; b != e; ++b) {
                *b = LabelsSolver::GetLabel(*b);
            }
        }

        LabelsSolver::Dealloc();
    }